

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

void __thiscall
ON_DimStyle::SetUnitSystemFromContext
          (ON_DimStyle *this,bool bUseName,LengthUnitSystem source_unit_system,
          LengthUnitSystem destination_unit_system)

{
  LengthUnitSystem LVar1;
  LengthUnitSystem LVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ON_NameHash *pOVar6;
  ON_DimStyle *this_00;
  ON_UUID *pOVar7;
  wchar_t *pwVar8;
  wchar_t *string1;
  uchar extraout_RDX [8];
  size_t c;
  ulong uVar9;
  uint uVar10;
  wchar_t *pwVar11;
  ON_UUID id_00;
  bool local_bc;
  ON_wString unit_name;
  ON_wString dim_style_name;
  ON_SimpleArray<ON_LengthUnitName> name_list;
  ON_UUID id;
  ON_NameHash name_hash;
  
  LVar2 = this->m_dimstyle_unitsystem;
  uVar10 = 0;
  if ((LVar2 != CustomUnits) && (uVar10 = 0, LVar2 != Unset)) {
    uVar10 = (uint)LVar2;
  }
  LVar2 = ON::LengthUnitSystemFromUnsigned(uVar10);
  if (((LVar2 == None) || (LVar2 == Unset)) || (LVar2 == CustomUnits)) {
    LVar2 = None;
  }
  uVar10 = 0;
  do {
    if ((2 < uVar10) || (LVar2 != None)) {
      if (LVar2 == None) {
        LVar2 = Millimeters;
      }
      LVar1 = this->m_dimstyle_unitsystem;
      if (((LVar1 == CustomUnits) || (LVar1 == Unset)) || (LVar2 != LVar1)) {
        SetUnitSystem(this,LVar2);
      }
      return;
    }
    if (bUseName || uVar10 != 0) {
      if (uVar10 == 0) {
        pOVar6 = ON_ModelComponent::NameHash(&this->super_ON_ModelComponent);
        name_hash.m_flags = pOVar6->m_flags;
        name_hash.m_sha1_hash.m_digest[0] = (pOVar6->m_sha1_hash).m_digest[0];
        name_hash.m_sha1_hash.m_digest[1] = (pOVar6->m_sha1_hash).m_digest[1];
        name_hash.m_sha1_hash.m_digest[2] = (pOVar6->m_sha1_hash).m_digest[2];
        name_hash.m_sha1_hash.m_digest[3] = (pOVar6->m_sha1_hash).m_digest[3];
        name_hash.m_sha1_hash.m_digest._4_8_ = *(undefined8 *)((pOVar6->m_sha1_hash).m_digest + 4);
        name_hash.m_sha1_hash.m_digest._12_8_ =
             *(undefined8 *)((pOVar6->m_sha1_hash).m_digest + 0xc);
        name_hash.m_parent_id.Data1 = (pOVar6->m_parent_id).Data1;
        name_hash.m_parent_id.Data2 = (pOVar6->m_parent_id).Data2;
        name_hash.m_parent_id.Data3 = (pOVar6->m_parent_id).Data3;
        name_hash.m_parent_id.Data4 = *&(pOVar6->m_parent_id).Data4;
        bVar3 = ON_NameHash::IsValidAndNotEmpty(&name_hash);
        if (bVar3) {
          this_00 = SystemDimstyleFromName(&name_hash);
          pOVar6 = ON_ModelComponent::NameHash(&this_00->super_ON_ModelComponent);
          bVar3 = ::operator==(&name_hash,pOVar6);
          if (!bVar3) goto LAB_00475e59;
          pOVar6 = ON_ModelComponent::NameHash(&Default.super_ON_ModelComponent);
          bVar3 = ::operator!=(&name_hash,pOVar6);
          if (!bVar3) goto LAB_00475e59;
LAB_00475ec5:
          LVar1 = this_00->m_dimstyle_unitsystem;
          LVar2 = None;
          if ((LVar1 != CustomUnits) && (LVar2 = None, LVar1 != Unset)) {
            LVar2 = LVar1;
          }
        }
        else {
LAB_00475e59:
          pOVar7 = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
          id.Data1 = pOVar7->Data1;
          id.Data2 = pOVar7->Data2;
          id.Data3 = pOVar7->Data3;
          id.Data4 = *&pOVar7->Data4;
          bVar3 = ::operator!=(&ON_nil_uuid,&id);
          if (bVar3) {
            id_00.Data4[0] = extraout_RDX[0];
            id_00.Data4[1] = extraout_RDX[1];
            id_00.Data4[2] = extraout_RDX[2];
            id_00.Data4[3] = extraout_RDX[3];
            id_00.Data4[4] = extraout_RDX[4];
            id_00.Data4[5] = extraout_RDX[5];
            id_00.Data4[6] = extraout_RDX[6];
            id_00.Data4[7] = extraout_RDX[7];
            id_00._0_8_ = id.Data4;
            this_00 = SystemDimstyleFromId((ON_DimStyle *)id._0_8_,id_00);
            pOVar7 = ON_ModelComponent::Id(&this_00->super_ON_ModelComponent);
            bVar3 = ::operator==(&id,pOVar7);
            if (bVar3) {
              pOVar7 = ON_ModelComponent::Id(&Default.super_ON_ModelComponent);
              bVar3 = ::operator!=(&id,pOVar7);
              if (bVar3) goto LAB_00475ec5;
            }
          }
          ON_ModelComponent::Name((ON_ModelComponent *)&dim_style_name);
          ON_wString::TrimLeftAndRight(&dim_style_name,(wchar_t *)0x0);
          ON_wString::MakeLowerOrdinal(&dim_style_name);
          bVar3 = ON_wString::IsEmpty(&dim_style_name);
          if (((bVar3) || (uVar4 = ON_wString::Length(&dim_style_name), (int)uVar4 < 1)) ||
             (uVar5 = ON_LengthUnitName::GetLengthUnitNameList(0,(ON_LengthUnitName *)0x0),
             uVar5 == 0)) {
            LVar2 = None;
          }
          else {
            c = (size_t)uVar5;
            ON_SimpleArray<ON_LengthUnitName>::ON_SimpleArray(&name_list,c);
            if (((int)uVar5 < 0) || (name_list.m_capacity < (int)uVar5)) {
              c = (size_t)(uint)name_list.m_count;
              uVar5 = name_list.m_count;
            }
            name_list.m_count = uVar5;
            ON_LengthUnitName::GetLengthUnitNameList(c,name_list.m_a);
            for (uVar9 = 0; uVar9 < (uint)name_list.m_count; uVar9 = uVar9 + 1) {
              LVar2 = ON_LengthUnitName::LengthUnit(name_list.m_a + uVar9);
              bVar3 = ON::IsTerrestrialLengthUnit(LVar2);
              if ((bVar3) &&
                 ((bVar3 = ON::IsMetricLengthUnit(LVar2), bVar3 ||
                  (bVar3 = ON::IsUnitedStatesCustomaryLengthUnit(LVar2), bVar3)))) {
                pwVar8 = ON_LengthUnitName::LengthUnitName(name_list.m_a + uVar9);
                ON_wString::ON_wString(&unit_name,pwVar8);
                ON_wString::TrimLeftAndRight(&unit_name,(wchar_t *)0x0);
                ON_wString::MakeLowerOrdinal(&unit_name);
                bVar3 = ON_wString::IsEmpty(&unit_name);
                if ((!bVar3) &&
                   (uVar5 = ON_wString::Length(&unit_name),
                   (int)uVar5 <= (int)uVar4 && 0 < (int)uVar5)) {
                  pwVar8 = ON_wString::operator_cast_to_wchar_t_(&dim_style_name);
                  pwVar11 = pwVar8 + ((ulong)uVar4 - (ulong)uVar5);
                  while (pwVar8 <= pwVar11) {
                    string1 = ON_wString::operator_cast_to_wchar_t_(&unit_name);
                    bVar3 = ON_wString::EqualOrdinal(string1,uVar5,pwVar8,uVar5,false);
                    pwVar8 = pwVar8 + 1;
                    if (bVar3) {
                      bVar3 = ON::IsUnitedStatesCustomaryLengthUnit(LVar2);
                      LVar2 = Millimeters;
                      if (bVar3) {
                        LVar2 = Inches;
                      }
                      ON_wString::~ON_wString(&unit_name);
                      goto LAB_004760c2;
                    }
                  }
                }
                ON_wString::~ON_wString(&unit_name);
              }
            }
            LVar2 = None;
LAB_004760c2:
            ON_SimpleArray<ON_LengthUnitName>::~ON_SimpleArray(&name_list);
          }
          ON_wString::~ON_wString(&dim_style_name);
        }
      }
      else {
        LVar1 = destination_unit_system;
        if (uVar10 == 1) {
          LVar1 = source_unit_system;
        }
        bVar3 = ON::IsUnitedStatesPrinterLengthUnit(LVar1);
        LVar2 = LVar1;
        if (!bVar3) {
          bVar3 = ON::IsTerrestrialLengthUnit(LVar1);
          if (!bVar3) goto LAB_00475ddc;
          bVar3 = ON::IsUnitedStatesCustomaryLengthUnit(LVar1);
          LVar2 = Inches;
          if (!bVar3) {
            bVar3 = ON::IsMetricLengthUnit(LVar1);
            LVar2 = bVar3 * '\x02';
          }
        }
      }
    }
    else {
LAB_00475ddc:
      LVar2 = None;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void ON_DimStyle::SetUnitSystemFromContext(
  bool bUseName,
  ON::LengthUnitSystem source_unit_system,
  ON::LengthUnitSystem destination_unit_system
)
{
  /// NOTE WELL: A dimstyle unit system was added in V6, but has never been fully used.
  /// The idea was this would make it easier to figure out what text height/ arrow size, 
  /// ... actually meant. Especially in situations where model space and page space have
  /// different unit systems, and in more complex cases like text in instance definitions
  /// and inserting annotation from models with mismatched unit systems.
  /// It is used internally to get some scales properly set and use in limited
  /// merging contexts.
  ///   
  /// From a user's perspective, in Rhino 6 and Rhino 7 ON_DimStyle lengths like TextHeight(), ArrowSize(), ... 
  /// are with respect to the context the annotation resides in. For example, if TextHeight() = 3.5,
  /// model units = meters, page units = millimeters, and DimScale() = 1, then
  /// text created in model space will be 3.5 meters high and
  /// text created in page space will be 3.5 millimeters high.
  /// 
  /// Ideally, ON_DimStyle::UnitSystem() would specify the text height units 
  /// and ON_DimStyle::DimScale() could be adjusted as model space extents require.
  /// Text in instance definitions would have a well defined height and references
  /// to those instance definitions would display predictably in both model space and page space.


  ON::LengthUnitSystem dim_style_units = ON::LengthUnitSystemFromUnsigned(static_cast<unsigned int>(UnitSystem()));

  switch (dim_style_units)
  {
    case ON::LengthUnitSystem::None:
    case ON::LengthUnitSystem::CustomUnits:
    case ON::LengthUnitSystem::Unset:
      dim_style_units = ON::LengthUnitSystem::None;
      break;
    default:
      break;
  }
  
  for (int pass = 0; pass < 3; pass++)
  {
    if (ON::LengthUnitSystem::None != dim_style_units)
      break;
    if (0 == pass && false == bUseName)
      continue;
    switch (pass)
    {
    case 0: // search dimstyle name for metric or United States customary unit system names
      {
        const ON_NameHash name_hash = NameHash();
        if (name_hash.IsValidAndNotEmpty())
        {
          const ON_DimStyle& from_name = ON_DimStyle::SystemDimstyleFromName(name_hash);
          if (name_hash == from_name.NameHash() && name_hash != ON_DimStyle::Default.NameHash())
          {
            dim_style_units = from_name.UnitSystem();
            continue;
          }
        }
    
        const ON_UUID id = Id();
        if (ON_nil_uuid != id )
        {
          const ON_DimStyle& from_id = ON_DimStyle::SystemDimstyleFromId(id);
          if (id == from_id.Id() && id != ON_DimStyle::Default.Id() )
          {
            dim_style_units = from_id.UnitSystem();
            continue;
          }
        }

        ON_wString dim_style_name = Name();
        dim_style_name.TrimLeftAndRight();
        dim_style_name.MakeLowerOrdinal();
        if (dim_style_name.IsEmpty())
          break;
        const int dim_style_name_length = dim_style_name.Length();
        if (dim_style_name_length <= 0)
          break;

        const size_t name_list_capacity = ON_LengthUnitName::GetLengthUnitNameList(0, nullptr);
        if (name_list_capacity <= 0)
          break;

        ON_SimpleArray<ON_LengthUnitName> name_list(name_list_capacity);
        name_list.SetCount((int)name_list_capacity);
        ON_LengthUnitName::GetLengthUnitNameList(name_list.UnsignedCount(), name_list.Array());
        
        for (unsigned int i = 0; i < name_list.UnsignedCount(); i++)
        {
          ON::LengthUnitSystem name_us = name_list[i].LengthUnit();
          if (false == ON::IsTerrestrialLengthUnit(name_us))
            continue;
          if (
            false == ON::IsMetricLengthUnit(name_us)
            && false == ON::IsUnitedStatesCustomaryLengthUnit(name_us) 
            )
            continue;
          ON_wString unit_name = name_list[i].LengthUnitName();
          unit_name.TrimLeftAndRight();
          unit_name.MakeLowerOrdinal();
          if (unit_name.IsEmpty())
            continue;
          const int name_length = unit_name.Length();
          if (name_length <= 0)
            continue;
          if (name_length > dim_style_name_length )
            continue;

          const wchar_t* s = static_cast<const wchar_t*>(dim_style_name);
          const wchar_t* s1 = s + dim_style_name_length - name_length;
          for (/*empty init*/; s <= s1; s++)
          {
            if (ON_wString::EqualOrdinal(static_cast<const wchar_t*>(unit_name), name_length, s, name_length, false))
            {
              if (ON::IsUnitedStatesCustomaryLengthUnit(name_us))
                dim_style_units = ON::LengthUnitSystem::Inches;
              else
                dim_style_units = ON::LengthUnitSystem::Millimeters;
              break;
            }
          }
          if (ON::LengthUnitSystem::None != dim_style_units)
            break;
        }
      }
      break;

    case 1:
    case 2:
      {
        const ON::LengthUnitSystem context_us
          = (1 == pass)
          ? source_unit_system
          : destination_unit_system;
        if (ON::IsUnitedStatesPrinterLengthUnit(context_us))
          dim_style_units = context_us;
        else if (ON::IsTerrestrialLengthUnit(context_us))
        {
          if (ON::IsUnitedStatesCustomaryLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Inches;
          else if (ON::IsMetricLengthUnit(context_us))
            dim_style_units = ON::LengthUnitSystem::Millimeters;
        }
      }
      break;
    }
  }

  if (ON::LengthUnitSystem::None == dim_style_units)
    dim_style_units = ON::LengthUnitSystem::Millimeters;

  if( dim_style_units != UnitSystem() )
    SetUnitSystem(dim_style_units);

  return;
}